

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O2

void gdImageFlipVertical(gdImagePtr im)

{
  uchar uVar1;
  int iVar2;
  int **ppiVar3;
  int *piVar4;
  int *piVar5;
  uchar *puVar6;
  long lVar7;
  long lVar8;
  
  if (im->trueColor == 0) {
    for (lVar7 = 0; lVar7 < im->sy / 2; lVar7 = lVar7 + 1) {
      for (lVar8 = 0; lVar8 < im->sx; lVar8 = lVar8 + 1) {
        puVar6 = im->pixels[lVar7];
        uVar1 = puVar6[lVar8];
        puVar6[lVar8] = im->pixels[(int)(im->sy + ~(uint)lVar7)][lVar8];
        im->pixels[(int)(im->sy + ~(uint)lVar7)][lVar8] = uVar1;
      }
    }
  }
  else {
    for (lVar7 = 0; lVar7 < im->sy / 2; lVar7 = lVar7 + 1) {
      ppiVar3 = im->tpixels;
      piVar4 = ppiVar3[lVar7];
      piVar5 = ppiVar3[(int)(im->sy + ~(uint)lVar7)];
      for (lVar8 = 0; lVar8 < im->sx; lVar8 = lVar8 + 1) {
        iVar2 = piVar4[lVar8];
        piVar4[lVar8] = ppiVar3[(int)(im->sy + ~(uint)lVar7)][lVar8];
        piVar5[lVar8] = iVar2;
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipVertical(gdImagePtr im)
{
	register int x, y;

	if (im->trueColor) {
		for (y = 0; y < im->sy / 2; y++) {
			int *row_dst = im->tpixels[y];
			int *row_src = im->tpixels[im->sy - 1 - y];
			for (x = 0; x < im->sx; x++) {
				register int p;
				p = row_dst[x];
				row_dst[x] = im->tpixels[im->sy - 1 - y][x];
				row_src[x] = p;
			}
		}
	} else {
		unsigned char p;
		for (y = 0; y < im->sy / 2; y++) {
			for (x = 0; x < im->sx; x++) {
				p = im->pixels[y][x];
				im->pixels[y][x] =	im->pixels[im->sy - 1 - y][x];
				im->pixels[im->sy - 1 - y][x] = p;
			}
		}
	}
	return;
}